

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * Diligent::FormatString<char[399]>(string *__return_storage_ptr__,char (*Args) [399])

{
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::operator<<(local_188,*Args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}